

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_str_utf8(nk_str *str,int pos,char *text)

{
  nk_rune *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  nk_rune unicode;
  int glyph_len;
  int num_runes;
  int byte_len;
  int runes;
  int local_34;
  int local_30;
  int clen;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  clen = 0;
  if ((in_RDI == 0) || (in_RDX == (nk_rune *)0x0)) {
    clen = 0;
  }
  else {
    local_30 = nk_utf_decode((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,0);
    while (local_34 != 0 && local_30 != 0) {
      local_30 = nk_utf_decode((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,clen);
    }
    nk_str_insert_at_rune
              ((nk_str *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RDX >> 0x20));
  }
  return clen;
}

Assistant:

NK_API int
nk_str_insert_str_utf8(struct nk_str *str, int pos, const char *text)
{
int runes = 0;
int byte_len = 0;
int num_runes = 0;
int glyph_len = 0;
nk_rune unicode;
if (!str || !text) return 0;

glyph_len = byte_len = nk_utf_decode(text+byte_len, &unicode, 4);
while (unicode != '\0' && glyph_len) {
glyph_len = nk_utf_decode(text+byte_len, &unicode, 4);
byte_len += glyph_len;
num_runes++;
}
nk_str_insert_at_rune(str, pos, text, byte_len);
return runes;
}